

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindCopy
          (ClientContext *context,CopyInfo *info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expected_names,vector<duckdb::LogicalType,_true> *expected_types)

{
  MultiFileOptions file_options_p;
  _Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false> _Var1;
  bool bVar2;
  type file_options_00;
  pointer pMVar3;
  NotImplementedException *this;
  pointer pbVar4;
  vector<duckdb::LogicalType,_true> *in_R8;
  vector<duckdb::LogicalType,_true> *expected_names_00;
  vector<duckdb::LogicalType,_true> *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_228 [16];
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_218;
  _Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false> local_210;
  BaseFileReaderOptions *local_208;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_200;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  undefined1 auStack_1e8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  paths;
  undefined8 in_stack_fffffffffffffe60;
  shared_ptr<duckdb::MultiFileList,_true> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  MultiFileOptions file_options;
  MultiFileOptions local_c8;
  
  expected_names_00 = in_R8;
  ParquetMultiFileInfo::InitializeOptions
            ((ClientContext *)&local_210,(optional_ptr<duckdb::TableFunctionInfo,_true>)info);
  MultiFileOptions::MultiFileOptions(&file_options);
  pbVar4 = (pointer)&expected_names[9].
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    pbVar4 = (pointer)(pbVar4->_M_dataplus)._M_p;
    if (pbVar4 == (pointer)0x0) {
      unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
      ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                   *)&local_210);
      std::__cxx11::string::string((string *)&file_list,"COPY",(allocator *)&paths);
      duckdb::MultiFileReader::CreateDefault((string *)&local_218);
      std::__cxx11::string::~string((string *)&file_list);
      std::__cxx11::string::string
                ((string *)&file_list,
                 (string *)
                 &expected_names[7].
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      __l._M_len = 1;
      __l._M_array = (iterator)&file_list;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&paths.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,__l,(allocator_type *)(auStack_228 + 0xf));
      std::__cxx11::string::~string((string *)&file_list);
      pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)&local_218);
      (**(code **)(*(long *)pMVar3 + 0x18))(&file_list,pMVar3,info,&paths,0);
      local_200._M_head_impl = local_218._M_head_impl;
      local_218._M_head_impl = (MultiFileReader *)0x0;
      local_198.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_198.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      MultiFileOptions::MultiFileOptions(&local_c8,&file_options);
      _Var1._M_head_impl = local_210._M_head_impl;
      local_208 = local_210._M_head_impl;
      local_210._M_head_impl = (BaseFileReaderOptions *)0x0;
      file_options_p.hive_types_schema._M_h._M_buckets = (__buckets_ptr)&local_208;
      file_options_p._0_8_ = &local_c8;
      file_options_p.hive_types_schema._M_h._M_bucket_count = auStack_228._0_8_;
      file_options_p.hive_types_schema._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)auStack_228._8_8_;
      file_options_p.hive_types_schema._M_h._M_element_count = (size_type)local_218._M_head_impl;
      file_options_p.hive_types_schema._M_h._M_rehash_policy._0_8_ = 0;
      file_options_p.hive_types_schema._M_h._M_rehash_policy._M_next_resize =
           (size_t)_Var1._M_head_impl;
      file_options_p.hive_types_schema._M_h._M_single_bucket =
           (__node_base_ptr)local_200._M_head_impl;
      file_options_p.filename_column._M_dataplus._M_p =
           (pointer)file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      file_options_p.filename_column._M_string_length =
           (size_type)
           file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      file_options_p._80_24_ = auStack_1e8;
      file_options_p.custom_options._M_h._M_bucket_count = (size_type)in_R8;
      file_options_p.custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)expected_types;
      file_options_p.custom_options._M_h._M_element_count = (size_type)context;
      file_options_p.custom_options._M_h._32_24_ =
           paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data;
      MultiFileBindInternal
                ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)context,(ClientContext *)info,
                 (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                  *)&local_200,&local_198,in_R8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)expected_types,file_options_p,
                 (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                  )in_stack_fffffffffffffe60);
      if (local_208 != (BaseFileReaderOptions *)0x0) {
        (*local_208->_vptr_BaseFileReaderOptions[1])();
      }
      local_208 = (BaseFileReaderOptions *)0x0;
      MultiFileOptions::~MultiFileOptions(&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_198.internal.
                  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (local_200._M_head_impl != (MultiFileReader *)0x0) {
        (**(code **)(*(long *)local_200._M_head_impl + 8))();
      }
      local_200._M_head_impl = (MultiFileReader *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&file_list.internal.
                  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      if (local_218._M_head_impl != (MultiFileReader *)0x0) {
        (**(code **)(*(long *)local_218._M_head_impl + 8))();
      }
      MultiFileOptions::~MultiFileOptions(&file_options);
      if (local_210._M_head_impl != (BaseFileReaderOptions *)0x0) {
        (*(local_210._M_head_impl)->_vptr_BaseFileReaderOptions[1])();
      }
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
    }
    duckdb::StringUtil::Lower((string *)&file_list);
    file_options_00 =
         unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
         ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                      *)&local_210);
    bVar2 = ParquetMultiFileInfo::ParseCopyOption
                      ((ClientContext *)info,(string *)&file_list,
                       (vector<duckdb::Value,_true> *)&pbVar4[1]._M_string_length,file_options_00,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)expected_names_00,in_R9);
    if (!bVar2) break;
    std::__cxx11::string::~string((string *)&file_list);
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&paths,"Unsupported option for COPY FROM: %s",(allocator *)&local_218);
  std::__cxx11::string::string((string *)&local_180,(string *)&pbVar4->_M_string_length);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this,(string *)&paths,&local_180);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> MultiFileBindCopy(ClientContext &context, CopyInfo &info,
	                                                  vector<string> &expected_names,
	                                                  vector<LogicalType> &expected_types) {
		auto options = OP::InitializeOptions(context, nullptr);
		MultiFileOptions file_options;

		for (auto &option : info.options) {
			auto loption = StringUtil::Lower(option.first);
			if (OP::ParseCopyOption(context, loption, option.second, *options, expected_names, expected_types)) {
				continue;
			}
			throw NotImplementedException("Unsupported option for COPY FROM: %s", option.first);
		}
		OP::FinalizeCopyBind(context, *options, expected_names, expected_types);

		// TODO: Allow overriding the MultiFileReader for COPY FROM?
		auto multi_file_reader = MultiFileReader::CreateDefault("COPY");
		vector<string> paths = {info.file_path};
		auto file_list = multi_file_reader->CreateFileList(context, paths);

		return MultiFileBindInternal(context, std::move(multi_file_reader), std::move(file_list), expected_types,
		                             expected_names, std::move(file_options), std::move(options));
	}